

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

int mpz_cmp(__mpz_struct *a,__mpz_struct *b)

{
  int iVar1;
  long lVar2;
  mp_limb_t mVar3;
  mp_limb_t mVar4;
  
  iVar1 = a->_mp_size;
  lVar2 = (long)iVar1;
  if (iVar1 != b->_mp_size) {
    return (uint)(b->_mp_size <= iVar1) * 2 + -1;
  }
  if (iVar1 < 0) {
    lVar2 = -lVar2;
    do {
      if (lVar2 < 1) {
        return 0;
      }
      mVar3 = b->_mp_d[lVar2 + -1];
      mVar4 = a->_mp_d[lVar2 + -1];
      lVar2 = lVar2 + -1;
    } while (mVar3 == mVar4);
  }
  else {
    do {
      if (lVar2 < 1) {
        return 0;
      }
      mVar3 = a->_mp_d[lVar2 + -1];
      mVar4 = b->_mp_d[lVar2 + -1];
      lVar2 = lVar2 + -1;
    } while (mVar3 == mVar4);
  }
  return (mVar4 < mVar3) - 1 | 1;
}

Assistant:

int
mpz_cmp (const mpz_t a, const mpz_t b)
{
  mp_size_t asize = a->_mp_size;
  mp_size_t bsize = b->_mp_size;

  if (asize != bsize)
    return (asize < bsize) ? -1 : 1;
  else if (asize >= 0)
    return mpn_cmp (a->_mp_d, b->_mp_d, asize);
  else
    return mpn_cmp (b->_mp_d, a->_mp_d, -asize);
}